

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  int iVar1;
  ostream *poVar2;
  XmlUnitTestResultPrinter *this_00;
  JsonUnitTestResultPrinter *this_01;
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar1 == 0) {
    this_00 = (XmlUnitTestResultPrinter *)operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_00,(char *)local_40[0]);
    TestEventListeners::SetDefaultXmlGenerator(&this->listeners_,(TestEventListener *)this_00);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_60);
      if (iVar1 != 0) {
        GTestLog::GTestLog((GTestLog *)local_40,GTEST_WARNING,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest.cc"
                           ,0x1604);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"WARNING: unrecognized output format \"",0x25);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_60,local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ignored.",10);
        GTestLog::~GTestLog((GTestLog *)local_40);
      }
      goto LAB_0014da64;
    }
    this_01 = (JsonUnitTestResultPrinter *)operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(this_01,(char *)local_40[0]);
    TestEventListeners::SetDefaultXmlGenerator(&this->listeners_,(TestEventListener *)this_01);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
LAB_0014da64:
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format == "json") {
    listeners()->SetDefaultXmlGenerator(new JsonUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format != "") {
    GTEST_LOG_(WARNING) << "WARNING: unrecognized output format \""
                        << output_format << "\" ignored.";
  }
}